

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

string * el::base::utils::OS::getBashOutput_abi_cxx11_(char *command)

{
  char *pcVar1;
  size_t sVar2;
  char *in_RSI;
  string *in_RDI;
  char hBuff [4096];
  FILE *proc;
  allocator local_1019 [4097];
  FILE *local_18;
  
  if (in_RSI == (char *)0x0) {
    ::std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    local_18 = (FILE *)0x0;
    local_18 = popen(in_RSI,"r");
    if (local_18 == (FILE *)0x0) {
      ::std::__cxx11::string::string((string *)in_RDI);
    }
    else {
      pcVar1 = fgets((char *)((long)local_1019 + 1),0x1000,local_18);
      if (pcVar1 == (char *)0x0) {
        pclose(local_18);
        ::std::__cxx11::string::string((string *)in_RDI);
      }
      else {
        pclose(local_18);
        sVar2 = strlen((char *)((long)local_1019 + 1));
        if (local_1019[sVar2] == (allocator)0xa) {
          sVar2 = strlen((char *)((long)local_1019 + 1));
          local_1019[sVar2] = (allocator)0x0;
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)in_RDI,(char *)((long)local_1019 + 1),local_1019);
        ::std::allocator<char>::~allocator((allocator<char> *)local_1019);
      }
    }
  }
  return in_RDI;
}

Assistant:

const std::string OS::getBashOutput(const char* command) {
#if (ELPP_OS_UNIX && !ELPP_OS_ANDROID && !ELPP_CYGWIN)
  if (command == nullptr) {
    return std::string();
  }
  FILE* proc = nullptr;
  if ((proc = popen(command, "r")) == nullptr) {
    ELPP_INTERNAL_ERROR("\nUnable to run command [" << command << "]", true);
    return std::string();
  }
  char hBuff[4096];
  if (fgets(hBuff, sizeof(hBuff), proc) != nullptr) {
    pclose(proc);
    if (hBuff[strlen(hBuff) - 1] == '\n') {
      hBuff[strlen(hBuff) - 1] = '\0';
    }
    return std::string(hBuff);
  } else {
    pclose(proc);
  }
  return std::string();
#else
  ELPP_UNUSED(command);
  return std::string();
#endif  // (ELPP_OS_UNIX && !ELPP_OS_ANDROID && !ELPP_CYGWIN)
}